

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<kj::(anonymous_namespace)::Nested> * __thiscall
kj::Own<kj::(anonymous_namespace)::Nested>::operator=
          (Own<kj::(anonymous_namespace)::Nested> *this,
          Own<kj::(anonymous_namespace)::Nested> *other)

{
  Disposer *pDVar1;
  Nested *pNVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  pDVar1 = this->disposer;
  pNVar2 = this->ptr;
  uVar3 = *(undefined4 *)((long)&other->disposer + 4);
  uVar4 = *(undefined4 *)&other->ptr;
  uVar5 = *(undefined4 *)((long)&other->ptr + 4);
  *(undefined4 *)&this->disposer = *(undefined4 *)&other->disposer;
  *(undefined4 *)((long)&this->disposer + 4) = uVar3;
  *(undefined4 *)&this->ptr = uVar4;
  *(undefined4 *)((long)&this->ptr + 4) = uVar5;
  other->ptr = (Nested *)0x0;
  if (pNVar2 != (Nested *)0x0) {
    (**pDVar1->_vptr_Disposer)();
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }